

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_encoder.h
# Opt level: O0

uint16_t quantize(float dctval,float errorTolerance)

{
  uint16_t hv;
  uint16_t src_00;
  float in_XMM0_Da;
  float fVar1;
  float in_XMM1_Da;
  int targetNumSetBits;
  uint16_t *closest;
  int numSetBits;
  uint16_t src;
  float srcFloat;
  uint16_t tmp;
  int local_2c;
  uint16_t *local_28;
  
  src_00 = float_to_half(in_XMM0_Da);
  local_2c = countSetBits(src_00);
  local_28 = closestData + closestDataOffset[src_00];
  while( true ) {
    local_2c = local_2c + -1;
    if (local_2c < 0) {
      return src_00;
    }
    hv = *local_28;
    fVar1 = half_to_float(hv);
    if (ABS(fVar1 - in_XMM0_Da) < in_XMM1_Da) break;
    local_28 = local_28 + 1;
  }
  return hv;
}

Assistant:

static inline uint16_t
quantize (float dctval, float errorTolerance)
{
    uint16_t        tmp;
    //float           srcFloat   = half_to_float (src);
    float           srcFloat   = dctval;
    uint16_t        src        = float_to_half (srcFloat);
    int             numSetBits = countSetBits (src);
    const uint16_t* closest    = closestData + closestDataOffset[src];

    for (int targetNumSetBits = numSetBits - 1; targetNumSetBits >= 0;
         --targetNumSetBits)
    {
        tmp = *closest;

        if (fabsf (half_to_float (tmp) - srcFloat) < errorTolerance) return tmp;

        closest++;
    }

    return src;
}